

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5PorterCreate(void *pCtx,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  Fts5Tokenizer *pTok;
  char *pcVar9;
  char **ppcVar10;
  int iVar11;
  long in_FS_OFFSET;
  fts5_tokenizer_v2 *pV2;
  void *pUserdata;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pUserdata = (void *)0x0;
  pV2 = (fts5_tokenizer_v2 *)0x0;
  if (nArg < 1) {
    pcVar9 = "unicode61";
  }
  else {
    pcVar9 = *azArg;
  }
  pTok = (Fts5Tokenizer *)sqlite3_malloc(0xa8);
  if (pTok == (Fts5Tokenizer *)0x0) {
    iVar8 = 7;
  }
  else {
    iVar11 = 0;
    memset(pTok,0,0xa8);
    iVar8 = (**(code **)((long)pCtx + 0x28))(pCtx,pcVar9,&pUserdata,&pV2);
    if (iVar8 == 0) {
      iVar8 = nArg + -1;
      if (nArg < 1) {
        iVar8 = 0;
      }
      ppcVar10 = (char **)0x0;
      if (iVar8 != 0) {
        ppcVar10 = azArg + 1;
      }
      iVar1 = pV2->iVersion;
      uVar2 = *(undefined4 *)&pV2->field_0x4;
      uVar3 = *(undefined4 *)&pV2->xCreate;
      uVar4 = *(undefined4 *)((long)&pV2->xCreate + 4);
      uVar5 = *(undefined4 *)((long)&pV2->xDelete + 4);
      uVar6 = *(undefined4 *)&pV2->xTokenize;
      uVar7 = *(undefined4 *)((long)&pV2->xTokenize + 4);
      *(undefined4 *)(pTok + 0x10) = *(undefined4 *)&pV2->xDelete;
      *(undefined4 *)(pTok + 0x14) = uVar5;
      *(undefined4 *)(pTok + 0x18) = uVar6;
      *(undefined4 *)(pTok + 0x1c) = uVar7;
      *(int *)pTok = iVar1;
      *(undefined4 *)(pTok + 4) = uVar2;
      *(undefined4 *)(pTok + 8) = uVar3;
      *(undefined4 *)(pTok + 0xc) = uVar4;
      iVar8 = (**(code **)(pTok + 8))(pUserdata,ppcVar10,iVar8,pTok + 0x20);
      if (iVar8 == 0) goto LAB_001d5eab;
    }
  }
  iVar11 = iVar8;
  fts5PorterDelete(pTok);
  pTok = (Fts5Tokenizer *)0x0;
LAB_001d5eab:
  *ppOut = pTok;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar11;
}

Assistant:

static int fts5PorterCreate(
  void *pCtx,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  fts5_api *pApi = (fts5_api*)pCtx;
  int rc = SQLITE_OK;
  PorterTokenizer *pRet;
  void *pUserdata = 0;
  const char *zBase = "unicode61";
  fts5_tokenizer_v2 *pV2 = 0;

  if( nArg>0 ){
    zBase = azArg[0];
  }

  pRet = (PorterTokenizer*)sqlite3_malloc(sizeof(PorterTokenizer));
  if( pRet ){
    memset(pRet, 0, sizeof(PorterTokenizer));
    rc = pApi->xFindTokenizer_v2(pApi, zBase, &pUserdata, &pV2);
  }else{
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    int nArg2 = (nArg>0 ? nArg-1 : 0);
    const char **az2 = (nArg2 ? &azArg[1] : 0);
    memcpy(&pRet->tokenizer_v2, pV2, sizeof(fts5_tokenizer_v2));
    rc = pRet->tokenizer_v2.xCreate(pUserdata, az2, nArg2, &pRet->pTokenizer);
  }

  if( rc!=SQLITE_OK ){
    fts5PorterDelete((Fts5Tokenizer*)pRet);
    pRet = 0;
  }
  *ppOut = (Fts5Tokenizer*)pRet;
  return rc;
}